

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O3

Ptr __thiscall Polymer::FindBindingSite(Polymer *this,Ptr *pol,string *promoter_name)

{
  pointer __s2;
  size_t sVar1;
  element_type *peVar2;
  size_t __n;
  pointer pIVar3;
  bool bVar4;
  int iVar5;
  long *plVar6;
  runtime_error *prVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  size_type *psVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  pointer pIVar9;
  shared_ptr<BindingSite> *__x;
  Ptr PVar10;
  VecPtr promoter_choices;
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  results;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  vector<std::shared_ptr<BindingSite>,_std::allocator<std::shared_ptr<BindingSite>_>_> local_e8;
  Ptr *local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  intervalVector local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_e8.
  super__Vector_base<std::shared_ptr<BindingSite>,_std::allocator<std::shared_ptr<BindingSite>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.
  super__Vector_base<std::shared_ptr<BindingSite>,_std::allocator<std::shared_ptr<BindingSite>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.
  super__Vector_base<std::shared_ptr<BindingSite>,_std::allocator<std::shared_ptr<BindingSite>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.
  super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d0 = pol;
  IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>::findOverlapping
            ((IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *)
             &pol[0x14].super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (long)*(int *)&pol[8].super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi,
             (long)*(int *)&pol[0x1e].super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,&local_a8);
  pIVar3 = local_a8.
           super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_a8.
      super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_a8.
      super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
LAB_001171ec:
    std::operator+(&local_50,"Polymerase ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((promoter_name->_M_dataplus)._M_p + 0x18));
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90._M_dataplus._M_p = (pointer)*plVar6;
    psVar8 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_90._M_dataplus._M_p == psVar8) {
      local_90.field_2._M_allocated_capacity = *psVar8;
      local_90.field_2._8_8_ = plVar6[3];
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    }
    else {
      local_90.field_2._M_allocated_capacity = *psVar8;
    }
    local_90._M_string_length = plVar6[1];
    *plVar6 = (long)psVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::operator+(&local_c8,&local_90,in_RCX);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_c8);
    local_108._M_dataplus._M_p = (pointer)*plVar6;
    psVar8 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_108._M_dataplus._M_p == psVar8) {
      local_108.field_2._M_allocated_capacity = *psVar8;
      local_108.field_2._8_8_ = plVar6[3];
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    }
    else {
      local_108.field_2._M_allocated_capacity = *psVar8;
    }
    local_108._M_string_length = plVar6[1];
    *plVar6 = (long)psVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::operator+(&local_70,&local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &local_d0[6].super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar7,(string *)&local_70);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar4 = false;
  pIVar9 = local_a8.
           super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    __s2 = (in_RCX->_M_dataplus)._M_p;
    sVar1 = in_RCX->_M_string_length;
    __x = &pIVar9->value;
    while( true ) {
      peVar2 = (__x->super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      __n = (peVar2->super_FixedElement).name_._M_string_length;
      if ((__n == sVar1) &&
         (((__n == 0 ||
           (iVar5 = bcmp((peVar2->super_FixedElement).name_._M_dataplus._M_p,__s2,__n), iVar5 == 0))
          && ((peVar2->super_FixedElement).covered_ < 1)))) break;
      pIVar9 = (pointer)(__x + 1);
      __x = __x + 2;
      if (pIVar9 == pIVar3) {
        if (!bVar4) goto LAB_001171ec;
        goto LAB_00117192;
      }
    }
    std::vector<std::shared_ptr<BindingSite>,_std::allocator<std::shared_ptr<BindingSite>_>_>::
    push_back(&local_e8,__x);
    pIVar9 = (pointer)(__x + 1);
    bVar4 = true;
    if (pIVar9 == pIVar3) {
LAB_00117192:
      Random::WeightedChoice<std::shared_ptr<BindingSite>>((Random *)this,&local_e8);
      bVar4 = BindingSite::CheckInteraction
                        ((BindingSite *)this->_vptr_Polymer,
                         (string *)((promoter_name->_M_dataplus)._M_p + 0x18));
      if (!bVar4) {
        std::operator+(&local_c8,"Polymerase ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((promoter_name->_M_dataplus)._M_p + 0x18));
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_c8);
        local_108._M_dataplus._M_p = (pointer)*plVar6;
        psVar8 = (size_type *)(plVar6 + 2);
        if ((size_type *)local_108._M_dataplus._M_p == psVar8) {
          local_108.field_2._M_allocated_capacity = *psVar8;
          local_108.field_2._8_8_ = plVar6[3];
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        }
        else {
          local_108.field_2._M_allocated_capacity = *psVar8;
        }
        local_108._M_string_length = plVar6[1];
        *plVar6 = (long)psVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::operator+(&local_70,&local_108,in_RCX);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p);
        }
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar7,(string *)&local_70);
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::
      vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
      ::~vector(&local_a8);
      std::vector<std::shared_ptr<BindingSite>,_std::allocator<std::shared_ptr<BindingSite>_>_>::
      ~vector(&local_e8);
      PVar10.super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      PVar10.super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (Ptr)PVar10.super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>;
    }
  } while( true );
}

Assistant:

BindingSite::Ptr Polymer::FindBindingSite(MobileElement::Ptr pol,
                                          const std::string &promoter_name) {
  // Make a list of free promoters that pol can bind
  bool found = false;
  BindingSite::VecPtr promoter_choices;
  std::vector<Interval<BindingSite::Ptr>> results;
  binding_sites_.findOverlapping(start_, mask_.start(), results);
  for (auto &interval : results) {
    if (interval.value->name() == promoter_name &&
        !interval.value->IsCovered()) {
      promoter_choices.push_back(interval.value);
      found = true;
    }
  }
  // Error checking
  if (!found) {
    std::string err = "Polymerase " + pol->name() +
                      " could not find free promoter " + promoter_name +
                      " to bind in the polymer " + name_;
    throw std::runtime_error(err);
  }
  // Randomly select promoter.
  BindingSite::Ptr elem = Random::WeightedChoice(promoter_choices);
  // More error checking.
  if (!elem->CheckInteraction(pol->name())) {
    std::string err = "Polymerase " + pol->name() +
                      " does not interact with promoter " + promoter_name;
    throw std::runtime_error(err);
  }
  return elem;
}